

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

ON_Xform * __thiscall
ON_Xform::operator*(ON_Xform *__return_storage_ptr__,ON_Xform *this,ON_Xform *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  double local_18;
  double dStack_10;
  
  dVar1 = this->m_xform[0][0];
  dVar2 = this->m_xform[0][1];
  dVar3 = this->m_xform[0][2];
  dVar4 = this->m_xform[0][3];
  dVar5 = rhs->m_xform[0][0];
  dVar6 = rhs->m_xform[0][1];
  dVar7 = rhs->m_xform[1][0];
  dVar8 = rhs->m_xform[1][1];
  dVar9 = rhs->m_xform[2][0];
  dVar10 = rhs->m_xform[2][1];
  dVar11 = rhs->m_xform[3][0];
  dVar12 = rhs->m_xform[3][1];
  local_88 = dVar4 * dVar11 + dVar3 * dVar9 + dVar1 * dVar5 + dVar2 * dVar7;
  dStack_80 = dVar4 * dVar12 + dVar3 * dVar10 + dVar1 * dVar6 + dVar2 * dVar8;
  dVar13 = rhs->m_xform[0][2];
  dVar14 = rhs->m_xform[0][3];
  dVar15 = rhs->m_xform[1][2];
  dVar16 = rhs->m_xform[1][3];
  dVar17 = rhs->m_xform[2][2];
  dVar18 = rhs->m_xform[2][3];
  dVar19 = rhs->m_xform[3][2];
  dVar20 = rhs->m_xform[3][3];
  local_78 = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  dStack_70 = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar1 = this->m_xform[1][0];
  dVar2 = this->m_xform[1][1];
  dVar3 = this->m_xform[1][2];
  dVar4 = this->m_xform[1][3];
  local_68 = dVar4 * dVar11 + dVar3 * dVar9 + dVar1 * dVar5 + dVar7 * dVar2;
  dStack_60 = dVar4 * dVar12 + dVar3 * dVar10 + dVar1 * dVar6 + dVar8 * dVar2;
  local_58 = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  dStack_50 = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar1 = this->m_xform[2][0];
  dVar2 = this->m_xform[2][1];
  dVar3 = this->m_xform[2][2];
  dVar4 = this->m_xform[2][3];
  local_48 = dVar4 * dVar11 + dVar3 * dVar9 + dVar1 * dVar5 + dVar7 * dVar2;
  dStack_40 = dVar4 * dVar12 + dVar3 * dVar10 + dVar1 * dVar6 + dVar8 * dVar2;
  local_38 = dVar4 * dVar19 + dVar3 * dVar17 + dVar1 * dVar13 + dVar2 * dVar15;
  dStack_30 = dVar4 * dVar20 + dVar3 * dVar18 + dVar1 * dVar14 + dVar2 * dVar16;
  dVar2 = this->m_xform[3][0];
  dVar3 = this->m_xform[3][1];
  dVar4 = this->m_xform[3][2];
  dVar1 = this->m_xform[3][3];
  local_28 = dVar11 * dVar1 + dVar9 * dVar4 + dVar5 * dVar2 + dVar7 * dVar3;
  dStack_20 = dVar12 * dVar1 + dVar10 * dVar4 + dVar6 * dVar2 + dVar8 * dVar3;
  local_18 = dVar1 * dVar19 + dVar4 * dVar17 + dVar2 * dVar13 + dVar3 * dVar15;
  dStack_10 = dVar1 * dVar20 + dVar4 * dVar18 + dVar2 * dVar14 + dVar3 * dVar16;
  ON_Xform(__return_storage_ptr__,(double (*) [4])&local_88);
  return __return_storage_ptr__;
}

Assistant:

ON_Xform ON_Xform::operator*( const ON_Xform& rhs ) const
{
  double m[4][4];
  const double* p = &rhs.m_xform[0][0];

  m[0][0] = m_xform[0][0]*p[0] + m_xform[0][1]*p[4] + m_xform[0][2]*p[ 8] + m_xform[0][3]*p[12];
  m[0][1] = m_xform[0][0]*p[1] + m_xform[0][1]*p[5] + m_xform[0][2]*p[ 9] + m_xform[0][3]*p[13];
  m[0][2] = m_xform[0][0]*p[2] + m_xform[0][1]*p[6] + m_xform[0][2]*p[10] + m_xform[0][3]*p[14];
  m[0][3] = m_xform[0][0]*p[3] + m_xform[0][1]*p[7] + m_xform[0][2]*p[11] + m_xform[0][3]*p[15];

  m[1][0] = m_xform[1][0]*p[0] + m_xform[1][1]*p[4] + m_xform[1][2]*p[ 8] + m_xform[1][3]*p[12];
  m[1][1] = m_xform[1][0]*p[1] + m_xform[1][1]*p[5] + m_xform[1][2]*p[ 9] + m_xform[1][3]*p[13];
  m[1][2] = m_xform[1][0]*p[2] + m_xform[1][1]*p[6] + m_xform[1][2]*p[10] + m_xform[1][3]*p[14];
  m[1][3] = m_xform[1][0]*p[3] + m_xform[1][1]*p[7] + m_xform[1][2]*p[11] + m_xform[1][3]*p[15];

  m[2][0] = m_xform[2][0]*p[0] + m_xform[2][1]*p[4] + m_xform[2][2]*p[ 8] + m_xform[2][3]*p[12];
  m[2][1] = m_xform[2][0]*p[1] + m_xform[2][1]*p[5] + m_xform[2][2]*p[ 9] + m_xform[2][3]*p[13];
  m[2][2] = m_xform[2][0]*p[2] + m_xform[2][1]*p[6] + m_xform[2][2]*p[10] + m_xform[2][3]*p[14];
  m[2][3] = m_xform[2][0]*p[3] + m_xform[2][1]*p[7] + m_xform[2][2]*p[11] + m_xform[2][3]*p[15];

  m[3][0] = m_xform[3][0]*p[0] + m_xform[3][1]*p[4] + m_xform[3][2]*p[ 8] + m_xform[3][3]*p[12];
  m[3][1] = m_xform[3][0]*p[1] + m_xform[3][1]*p[5] + m_xform[3][2]*p[ 9] + m_xform[3][3]*p[13];
  m[3][2] = m_xform[3][0]*p[2] + m_xform[3][1]*p[6] + m_xform[3][2]*p[10] + m_xform[3][3]*p[14];
  m[3][3] = m_xform[3][0]*p[3] + m_xform[3][1]*p[7] + m_xform[3][2]*p[11] + m_xform[3][3]*p[15];

  return ON_Xform(m);
}